

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

void duckdb::CTableFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  CTableBindData *pCVar1;
  GlobalTableFunctionState *pGVar2;
  LocalTableFunctionState *pLVar3;
  InvalidInputException *this;
  CTableInternalFunctionInfo function_info;
  
  pCVar1 = (CTableBindData *)
           optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  pLVar3 = optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&data_p->local_state);
  function_info.init_data = (CTableInitData *)(pGVar2 + 1);
  function_info.local_data = (CTableInitData *)(pLVar3 + 1);
  function_info.success = true;
  function_info.error._M_dataplus._M_p = (pointer)&function_info.error.field_2;
  function_info.error._M_string_length = 0;
  function_info.error.field_2._M_local_buf[0] = '\0';
  function_info.bind_data = pCVar1;
  (*pCVar1->info->function)(&function_info,output);
  if (function_info.success != false) {
    ::std::__cxx11::string::~string((string *)&function_info.error);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,(string *)&function_info.error);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CTableFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<CTableBindData>();
	auto &global_data = data_p.global_state->Cast<CTableGlobalInitData>();
	auto &local_data = data_p.local_state->Cast<CTableLocalInitData>();
	CTableInternalFunctionInfo function_info(bind_data, global_data.init_data, local_data.init_data);
	bind_data.info.function(ToCFunctionInfo(function_info), reinterpret_cast<duckdb_data_chunk>(&output));
	if (!function_info.success) {
		throw InvalidInputException(function_info.error);
	}
}